

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O3

cmListFileContext *
cmListFileContext::FromListFileFunction
          (cmListFileContext *__return_storage_ptr__,cmListFileFunction *lff,string *fileName,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId)

{
  (__return_storage_ptr__->Name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Name).field_2
  ;
  (__return_storage_ptr__->Name)._M_string_length = 0;
  (__return_storage_ptr__->Name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->FilePath)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->FilePath).field_2;
  (__return_storage_ptr__->FilePath)._M_string_length = 0;
  (__return_storage_ptr__->FilePath).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->Line = 0;
  (__return_storage_ptr__->DeferId).
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->FilePath);
  __return_storage_ptr__->Line =
       ((lff->Impl).
        super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->Line;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&__return_storage_ptr__->DeferId,
                   (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)deferId);
  return __return_storage_ptr__;
}

Assistant:

static cmListFileContext FromListFileFunction(
    cmListFileFunction const& lff, std::string const& fileName,
    cm::optional<std::string> deferId = {})
  {
    cmListFileContext lfc;
    lfc.FilePath = fileName;
    lfc.Line = lff.Line();
    lfc.Name = lff.OriginalName();
    lfc.DeferId = std::move(deferId);
    return lfc;
  }